

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadSplat<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,unsigned_int>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  RunResult RVar2;
  undefined1 auVar3 [16];
  Value value;
  ushort local_a;
  
  RVar1 = Load<unsigned_short>(this,instr,&local_a,out_trap);
  RVar2 = Trap;
  if (RVar1 == Ok) {
    auVar3 = pshuflw(ZEXT216(local_a),ZEXT216(local_a),0);
    value._8_8_ = auVar3._0_8_;
    value.i64_ = value._8_8_;
    Push(this,value);
    RVar2 = Ok;
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoSimdLoadSplat(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}